

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O2

bool __thiscall qpdf::Stream::isRootMetadata(Stream *this)

{
  bool bVar1;
  QPDFObjectHandle root_metadata;
  allocator<char> local_6a;
  allocator<char> local_69;
  undefined1 local_68 [16];
  string local_58;
  string local_38;
  
  getDict((Stream *)local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_68 + 0x10),"/Metadata",&local_6a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"/XML",&local_69);
  bVar1 = QPDFObjectHandle::isDictionaryOfType
                    ((QPDFObjectHandle *)local_68,(string *)(local_68 + 0x10),&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)(local_68 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
  if (bVar1) {
    QPDF::getRoot((QPDF *)local_68);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_68 + 0x10),"/Metadata",&local_6a);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_38,(string *)local_68);
    std::__cxx11::string::~string((string *)(local_68 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_68 + 0x10),
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this);
    bVar1 = QPDFObjectHandle::isSameObjectAs
                      ((QPDFObjectHandle *)&local_38,(QPDFObjectHandle *)(local_68 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38._M_string_length);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool
Stream::isRootMetadata() const
{
    if (!getDict().isDictionaryOfType("/Metadata", "/XML")) {
        return false;
    }
    auto root_metadata = qpdf()->getRoot().getKey("/Metadata");
    return root_metadata.isSameObjectAs(obj);
}